

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O3

BN * __thiscall BN::operator--(BN *this)

{
  unsigned_short uVar1;
  pointer puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  pointer puVar3;
  unsigned_short *i;
  pointer puVar4;
  ulong uVar5;
  
  __range1 = &this->ba;
  puVar2 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar3 = (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish;
  puVar4 = puVar2;
  while( true ) {
    if (puVar4 == puVar3) {
      uVar5 = (long)puVar3 - (long)puVar2;
      while ((2 < uVar5 && (puVar3 = puVar3 + -1, *puVar3 == 0))) {
        (this->ba).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar3;
        uVar5 = uVar5 - 2;
      }
      return (BN *)__range1;
    }
    uVar1 = *puVar4;
    *puVar4 = *puVar4 - 1;
    if (uVar1 != 0) break;
    puVar4 = puVar4 + 1;
  }
  return (BN *)__range1;
}

Assistant:

BN & BN::operator --() noexcept
{
    for (auto& i : ba) {
        if (i) {
            --i;
            return *this;
        }
        --i;
    }
    Norm(ba);

    return *this;
}